

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void pack_overflow(object *obj)

{
  loc_conflict grid;
  _Bool _Var1;
  char local_68 [8];
  char o_name [80];
  object *poStack_10;
  wchar_t i;
  object *obj_local;
  
  poStack_10 = obj;
  _Var1 = pack_is_overfull();
  if (_Var1) {
    disturb(player);
    msg("Your pack overflows!");
    o_name[0x4c] = '\x01';
    o_name[0x4d] = '\0';
    o_name[0x4e] = '\0';
    o_name[0x4f] = '\0';
    for (; ((int)o_name._76_4_ <= (int)(uint)z_info->pack_size &&
           (player->upkeep->inven[(int)o_name._76_4_] != (object *)0x0));
        o_name._76_4_ = o_name._76_4_ + 1) {
    }
    if (poStack_10 == (object *)0x0) {
      poStack_10 = player->upkeep->inven[o_name._76_4_ + -1];
    }
    if (poStack_10 == (object *)0x0) {
      __assert_fail("obj != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                    ,0x56f,"void pack_overflow(struct object *)");
    }
    object_desc(local_68,0x50,poStack_10,0x43,player);
    msg("You drop %s.",local_68);
    gear_excise_object(player,poStack_10);
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&stack0xfffffffffffffff0,L'\0',grid,false,true);
    msg("You no longer have %s.",local_68);
    if (player->upkeep->notice != 0) {
      notice_stuff(player);
    }
    if (player->upkeep->update != 0) {
      update_stuff(player);
    }
    if (player->upkeep->redraw != 0) {
      redraw_stuff(player);
    }
  }
  return;
}

Assistant:

void pack_overflow(struct object *obj)
{
	int i;
	char o_name[80];

	if (!pack_is_overfull()) return;

	/* Disturbing */
	disturb(player);

	/* Warning */
	msg("Your pack overflows!");

	/* Get the last proper item */
	for (i = 1; i <= z_info->pack_size; i++)
		if (!player->upkeep->inven[i])
			break;

	/* Drop the last inventory item unless requested otherwise */
	if (!obj) {
		obj = player->upkeep->inven[i - 1];
	}

	/* Rule out weirdness (like pack full, but inventory empty) */
	assert(obj != NULL);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	msg("You drop %s.", o_name);

	/* Excise the object and drop it (carefully) near the player */
	gear_excise_object(player, obj);
	drop_near(cave, &obj, 0, player->grid, false, true);

	/* Describe */
	msg("You no longer have %s.", o_name);

	/* Notice, update, redraw */
	if (player->upkeep->notice) notice_stuff(player);
	if (player->upkeep->update) update_stuff(player);
	if (player->upkeep->redraw) redraw_stuff(player);
}